

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void restoreCursor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  XUngrabPointer(_glfw.x11.display,0);
  if (window->cursor == (_GLFWcursor *)0x0) {
    XUndefineCursor(_glfw.x11.display,(window->x11).handle);
  }
  else {
    XDefineCursor(_glfw.x11.display,(window->x11).handle,(window->cursor->x11).handle);
  }
  return;
}

Assistant:

static void restoreCursor(_GLFWwindow* window)
{
    XUngrabPointer(_glfw.x11.display, CurrentTime);

    if (window->cursor)
    {
        XDefineCursor(_glfw.x11.display, window->x11.handle,
                      window->cursor->x11.handle);
    }
    else
        XUndefineCursor(_glfw.x11.display, window->x11.handle);
}